

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

int xmlNodeGetBaseSafe(xmlDoc *doc,xmlNode *cur,xmlChar **baseOut)

{
  xmlNode *node;
  int iVar1;
  ulong uVar2;
  xmlChar *URI;
  long lVar3;
  xmlChar *pxVar4;
  _xmlNode **pp_Var5;
  xmlEntityPtr ent;
  xmlChar *local_50;
  undefined4 local_44;
  xmlChar *newbase;
  xmlChar *base;
  
  local_50 = (xmlChar *)0x0;
  if (baseOut == (xmlChar **)0x0) {
    return 1;
  }
  *baseOut = (xmlChar *)0x0;
  uVar2 = (ulong)doc | (ulong)cur;
  if (uVar2 == 0) {
    return 1;
  }
  if ((cur != (xmlNode *)0x0) && (cur->type == XML_NAMESPACE_DECL)) {
    return 1;
  }
  if ((doc == (xmlDoc *)0x0) && (doc = cur->doc, doc == (_xmlDoc *)0x0)) {
    local_44 = (undefined4)CONCAT71((int7)(uVar2 >> 8),1);
    doc = (_xmlDoc *)0x0;
  }
  else {
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
      pp_Var5 = &doc->children;
      while( true ) {
        node = *pp_Var5;
        if (node == (xmlNode *)0x0) {
          return 0;
        }
        if (node->name == (xmlChar *)0x0) {
          return 0;
        }
        lVar3 = 0x30;
        if ((((node->type == XML_ELEMENT_NODE) &&
             (iVar1 = xmlStrcasecmp(node->name,"html"), lVar3 = 0x18, iVar1 != 0)) &&
            (iVar1 = xmlStrcasecmp(node->name,"head"), iVar1 != 0)) &&
           (iVar1 = xmlStrcasecmp(node->name,"base"), lVar3 = 0x30, iVar1 == 0)) break;
        pp_Var5 = (_xmlNode **)((long)&node->_private + lVar3);
      }
      iVar1 = xmlNodeGetAttrValue(node,"href",(xmlChar *)0x0,&local_50);
      if (iVar1 < 0) {
        return -1;
      }
      URI = local_50;
      if (local_50 == (xmlChar *)0x0) {
        return 1;
      }
      goto LAB_0014d1ee;
    }
    local_44 = 0;
  }
  URI = (xmlChar *)0x0;
  for (; cur != (xmlNode *)0x0; cur = cur->parent) {
    if (cur->type == XML_ELEMENT_NODE) {
      iVar1 = xmlNodeGetAttrValue(cur,"base",(xmlChar *)"http://www.w3.org/XML/1998/namespace",&base
                                 );
      if (iVar1 < 0) {
        (*xmlFree)(URI);
        return -1;
      }
      if (base != (xmlChar *)0x0) {
        pxVar4 = base;
        if (URI != (xmlChar *)0x0) {
          iVar1 = xmlBuildURISafe(URI,base,&newbase);
          (*xmlFree)(local_50);
          (*xmlFree)(base);
          pxVar4 = newbase;
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        URI = pxVar4;
        local_50 = URI;
        iVar1 = xmlStrncmp(URI,(xmlChar *)"http://",7);
        if (((iVar1 == 0) || (iVar1 = xmlStrncmp(URI,(xmlChar *)"ftp://",6), iVar1 == 0)) ||
           (iVar1 = xmlStrncmp(URI,(xmlChar *)"urn:",4), iVar1 == 0)) goto LAB_0014d1ee;
      }
    }
    else if (cur->type == XML_ENTITY_DECL) {
      if (cur[1]._private != (void *)0x0) {
        (*xmlFree)(URI);
        pxVar4 = (xmlChar *)cur[1]._private;
        goto LAB_0014d1e1;
      }
      break;
    }
  }
  if (((char)local_44 == '\0') && (pxVar4 = doc->URL, pxVar4 != (xmlChar *)0x0)) {
    if (URI == (xmlChar *)0x0) {
LAB_0014d1e1:
      URI = xmlStrdup(pxVar4);
      if (URI == (xmlChar *)0x0) {
        return -1;
      }
    }
    else {
      iVar1 = xmlBuildURISafe(URI,pxVar4,&newbase);
      (*xmlFree)(local_50);
      URI = newbase;
      if (iVar1 != 0) {
        return iVar1;
      }
    }
  }
LAB_0014d1ee:
  *baseOut = URI;
  return 0;
}

Assistant:

int
xmlNodeGetBaseSafe(const xmlDoc *doc, const xmlNode *cur, xmlChar **baseOut) {
    xmlChar *ret = NULL;
    xmlChar *base, *newbase;
    int res;

    if (baseOut == NULL)
        return(1);
    *baseOut = NULL;
    if ((cur == NULL) && (doc == NULL))
        return(1);
    if ((cur != NULL) && (cur->type == XML_NAMESPACE_DECL))
        return(1);
    if (doc == NULL)
        doc = cur->doc;

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE)) {
        cur = doc->children;
	while ((cur != NULL) && (cur->name != NULL)) {
	    if (cur->type != XML_ELEMENT_NODE) {
	        cur = cur->next;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "html")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "head")) {
	        cur = cur->children;
		continue;
	    }
	    if (!xmlStrcasecmp(cur->name, BAD_CAST "base")) {
                if (xmlNodeGetAttrValue(cur, BAD_CAST "href", NULL, &ret) < 0)
                    return(-1);
                if (ret == NULL)
                    return(1);
                goto found;
	    }
	    cur = cur->next;
	}
	return(0);
    }

    while (cur != NULL) {
	if (cur->type == XML_ENTITY_DECL) {
	    xmlEntityPtr ent = (xmlEntityPtr) cur;

            if (ent->URI == NULL)
                break;
            xmlFree(ret);
	    ret = xmlStrdup(ent->URI);
            if (ret == NULL)
                return(-1);
            goto found;
	}
	if (cur->type == XML_ELEMENT_NODE) {
	    if (xmlNodeGetAttrValue(cur, BAD_CAST "base", XML_XML_NAMESPACE,
                                    &base) < 0) {
                xmlFree(ret);
                return(-1);
            }
	    if (base != NULL) {
		if (ret != NULL) {
		    res = xmlBuildURISafe(ret, base, &newbase);
                    xmlFree(ret);
                    xmlFree(base);
                    if (res != 0)
                        return(res);
		    ret = newbase;
		} else {
		    ret = base;
		}
		if ((!xmlStrncmp(ret, BAD_CAST "http://", 7)) ||
		    (!xmlStrncmp(ret, BAD_CAST "ftp://", 6)) ||
		    (!xmlStrncmp(ret, BAD_CAST "urn:", 4)))
                    goto found;
	    }
	}
	cur = cur->parent;
    }

    if ((doc != NULL) && (doc->URL != NULL)) {
	if (ret == NULL) {
	    ret = xmlStrdup(doc->URL);
            if (ret == NULL)
                return(-1);
        } else {
            res = xmlBuildURISafe(ret, doc->URL, &newbase);
            xmlFree(ret);
            if (res != 0)
                return(res);
            ret = newbase;
        }
    }

found:
    *baseOut = ret;
    return(0);
}